

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O2

void __thiscall MallocBlock::Initialize(MallocBlock *this,size_t size,int type)

{
  size_t *key;
  size_t sVar1;
  int iVar2;
  bool bVar3;
  ThreadCache *this_00;
  char *pcVar4;
  MallocBlock *cthis;
  uint cl;
  ThreadCachePtr TVar5;
  undefined8 uStack_50;
  AddressMap<int> *local_40;
  void *rv;
  
  if ((this->magic1_ == 0xabcdefab) || (this->magic1_ == 0xdeadbeef)) {
    rv._0_4_ = type;
    SpinLock::Lock(&alloc_map_lock_);
    if (alloc_map_ == (AllocMap *)0x0) {
      TVar5 = tcmalloc::ThreadCachePtr::Grab();
      this_00 = TVar5.ptr_;
      cl = (uint)DAT_0013b40d;
      rv._4_4_ = this_00->list_[DAT_0013b40d].size_;
      bVar3 = tcmalloc::ThreadCache::FreeList::TryPop(this_00->list_ + DAT_0013b40d,&local_40);
      if (bVar3) {
        this_00->size_ = this_00->size_ - rv._4_4_;
      }
      else {
        local_40 = (AddressMap<int> *)
                   tcmalloc::ThreadCache::FetchFromCentralCache
                             (this_00,cl,rv._4_4_,anon_unknown.dwarf_513c::nop_oom_handler);
      }
      AddressMap<int>::AddressMap
                (local_40,anon_unknown.dwarf_513c::do_malloc,anon_unknown.dwarf_513c::do_free);
      alloc_map_ = local_40;
    }
    iVar2 = (int)rv;
    key = this->size_and_magic2_;
    AddressMap<int>::Insert(alloc_map_,key,(int)rv);
    this->size1_ = size;
    this->offset_ = 0;
    this->alloc_type_ = (long)iVar2;
    if (this->magic1_ != 0xabcdefab) {
      *(size_t *)((long)this->size_and_magic2_ + size + 8) = this->magic1_;
      *(size_t *)((long)this->size_and_magic2_ + this->size1_) = size;
    }
    SpinLock::Unlock(&alloc_map_lock_);
    memset(key,0xab,size);
    if (this->magic1_ == 0xabcdefab) {
      return;
    }
    sVar1 = this->size1_;
    if (sVar1 == *(size_t *)((long)key + sVar1)) {
      if (this->magic1_ == *(size_t *)((long)key + sVar1 + 8)) {
        return;
      }
      pcVar4 = "Check failed: memcmp(&magic1_, magic2_addr(), sizeof(magic1_)) == 0: should hold\n";
      uStack_50 = 0x51;
    }
    else {
      pcVar4 = "Check failed: memcmp(&size1_, size2_addr(), sizeof(size1_)) == 0: should hold\n";
      uStack_50 = 0x4e;
    }
  }
  else {
    pcVar4 = "Check failed: IsValidMagicValue(magic1_): \n";
    uStack_50 = 0x2b;
  }
  syscall(1,2,pcVar4,uStack_50);
  abort();
}

Assistant:

void Initialize(size_t size, int type) {
    RAW_CHECK(IsValidMagicValue(magic1_), "");
    // record us as allocated in the map
    alloc_map_lock_.Lock();
    if (!alloc_map_) {
      void* p = do_malloc(sizeof(AllocMap));
      alloc_map_ = new(p) AllocMap(do_malloc, do_free);
    }
    alloc_map_->Insert(data_addr(), type);
    // initialize us
    size1_ = size;
    offset_ = 0;
    alloc_type_ = type;
    if (!IsMMapped()) {
      bit_store(magic2_addr(), &magic1_);
      bit_store(size2_addr(), &size);
    }
    alloc_map_lock_.Unlock();
    memset(data_addr(), kMagicUninitializedByte, size);
    if (!IsMMapped()) {
      RAW_CHECK(memcmp(&size1_, size2_addr(), sizeof(size1_)) == 0, "should hold");
      RAW_CHECK(memcmp(&magic1_, magic2_addr(), sizeof(magic1_)) == 0, "should hold");
    }
  }